

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall Liby::EventQueue::wakeup(EventQueue *this)

{
  ssize_t local_20;
  int local_14;
  EventQueue *pEStack_10;
  int targetfd;
  EventQueue *this_local;
  
  local_14 = this->eventfd_;
  pEStack_10 = this;
  local_20 = write(local_14,&wakeup::this_is_a_number,8);
  ClearUnuseVariableWarning<long>(&local_20);
  return;
}

Assistant:

void EventQueue::wakeup() {
    static int64_t this_is_a_number = 1;
    int targetfd;
#ifdef __linux__
    targetfd = eventfd_;
#elif defined(__APPLE__)
    targetfd = event2fd_;
#endif
    ClearUnuseVariableWarning(
        ::write(targetfd, &this_is_a_number, sizeof(this_is_a_number)));
}